

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecore.cpp
# Opt level: O2

void __thiscall CCharacterCore::Tick(CCharacterCore *this,bool UseInput)

{
  vec2 *v;
  vec2 *a;
  undefined4 uVar1;
  undefined4 uVar2;
  vector2_base<float> target_point;
  int iVar3;
  int iVar4;
  long lVar5;
  CWorldCore *pCVar6;
  CCharacterCore *pCVar7;
  CTuneParam *pCVar8;
  undefined1 auVar9 [16];
  CTuningParams *pCVar10;
  CTuningParams *pCVar11;
  bool bVar12;
  bool bVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  int i;
  long lVar17;
  CTuneParam *pCVar18;
  int i_1;
  ulong uVar19;
  long in_FS_OFFSET;
  float fVar20;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar22;
  vec2 vVar23;
  float fVar21;
  vector2_base<float> vVar24;
  vec2 vVar25;
  vec2 vVar26;
  vec2 vVar27;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar31;
  vec2 vVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar32;
  vec2 vVar33;
  float fVar37;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  float fVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 in_XMM4_Db;
  undefined4 in_XMM4_Dc;
  undefined4 in_XMM4_Dd;
  float Distance;
  undefined1 auStack_84 [12];
  vec2 NewPos;
  
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  this->m_TriggeredEvents = 0;
  bVar12 = CCollision::CheckPoint
                     (this->m_pCollision,(this->m_Pos).field_0.x + 14.0,
                      (this->m_Pos).field_1.y + 14.0 + 5.0,1);
  bVar13 = true;
  if (!bVar12) {
    bVar13 = CCollision::CheckPoint
                       (this->m_pCollision,(this->m_Pos).field_0.x + -14.0,
                        (this->m_Pos).field_1.y + 14.0 + 5.0,1);
  }
  uVar1 = (this->m_Input).m_TargetX;
  uVar2 = (this->m_Input).m_TargetY;
  pCVar6 = this->m_pWorld;
  pCVar10 = &pCVar6->m_Tuning;
  pCVar11 = &pCVar6->m_Tuning;
  pCVar8 = &(pCVar6->m_Tuning).m_GroundControlAccel;
  pCVar18 = &(pCVar6->m_Tuning).m_GroundFriction;
  if (bVar13 == false) {
    pCVar18 = &(pCVar6->m_Tuning).m_AirFriction;
    pCVar6 = (CWorldCore *)&(pCVar6->m_Tuning).m_AirControlSpeed;
    pCVar8 = &pCVar11->m_AirControlAccel;
  }
  (this->m_Vel).field_1.y = (float)(pCVar10->m_Gravity).m_Value / 100.0 + (this->m_Vel).field_1.y;
  iVar15 = (pCVar6->m_Tuning).m_GroundControlSpeed.m_Value;
  iVar3 = pCVar8->m_Value;
  iVar4 = pCVar18->m_Value;
  if (UseInput) {
    auStack_84._0_4_ = in_XMM4_Db;
    Distance = (float)iVar3;
    auStack_84._4_4_ = in_XMM4_Dc;
    auStack_84._8_4_ = in_XMM4_Dd;
    vVar23.field_0.x = (float)(int)uVar1;
    vVar23.field_1.y = (float)(int)uVar2;
    this->m_Direction = (this->m_Input).m_Direction;
    NewPos = vVar23;
    fVar20 = angle(&NewPos);
    this->m_Angle = (int)(fVar20 * 256.0);
    uVar14 = this->m_Jumped;
    if ((this->m_Input).m_Jump == 0) {
      uVar14 = uVar14 & 0xfffffffe;
LAB_0013fb9f:
      this->m_Jumped = uVar14;
    }
    else if ((uVar14 & 1) == 0) {
      if (bVar13 == false) {
        if ((uVar14 & 2) != 0) goto LAB_0013fba2;
        *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 2;
        (this->m_Vel).field_1.y =
             (float)(this->m_pWorld->m_Tuning).m_AirJumpImpulse.m_Value / -100.0;
        uVar14 = uVar14 | 3;
      }
      else {
        *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 1;
        (this->m_Vel).field_1.y =
             (float)(this->m_pWorld->m_Tuning).m_GroundJumpImpulse.m_Value / -100.0;
        uVar14 = uVar14 | 1;
      }
      goto LAB_0013fb9f;
    }
LAB_0013fba2:
    if ((this->m_Input).m_Hook == 0) {
      this->m_HookState = 0;
      this->m_HookedPlayer = -1;
      this->m_HookPos = this->m_Pos;
    }
    else if (this->m_HookState == 0) {
      auVar38._8_8_ = 0;
      auVar38._0_4_ = vVar23.field_0;
      auVar38._4_4_ = vVar23.field_1;
      auVar29._0_4_ =
           SQRT(vVar23.field_0.x * vVar23.field_0.x + vVar23.field_1.y * vVar23.field_1.y);
      auVar29._4_4_ = auVar29._0_4_;
      auVar29._8_4_ = auVar29._0_4_;
      auVar29._12_4_ = auVar29._0_4_;
      auVar38 = divps(auVar38,auVar29);
      fVar32 = (this->m_Pos).field_0.x + auVar38._0_4_ * 28.0 * 1.5;
      fVar37 = (this->m_Pos).field_1.y + auVar38._4_4_ * 28.0 * 1.5;
      (this->m_HookPos).field_0 = (anon_union_4_2_94730284_for_vector2_base<float>_1)fVar32;
      (this->m_HookPos).field_1 = (anon_union_4_2_947302a4_for_vector2_base<float>_3)fVar37;
      (this->m_HookDir).field_0 =
           (anon_union_4_2_94730284_for_vector2_base<float>_1)(int)auVar38._0_8_;
      (this->m_HookDir).field_1 =
           (anon_union_4_2_947302a4_for_vector2_base<float>_3)(int)((ulong)auVar38._0_8_ >> 0x20);
      this->m_HookedPlayer = -1;
      this->m_HookTick = 0;
      this->m_HookState = 4;
    }
  }
  fVar20 = (float)iVar15 / 100.0;
  Distance = (float)iVar3 / 100.0;
  iVar15 = this->m_Direction;
  if (iVar15 < 0) {
    auStack_84._0_4_ = in_XMM4_Db;
    auStack_84._4_4_ = in_XMM4_Dc;
    auStack_84._8_4_ = in_XMM4_Dd;
    fVar21 = SaturatedAdd<float>(-fVar20,fVar20,(this->m_Vel).field_0.x,-Distance);
    (this->m_Vel).field_0.x = fVar21;
    iVar15 = this->m_Direction;
  }
  if (0 < iVar15) {
    fVar20 = SaturatedAdd<float>(-fVar20,fVar20,(this->m_Vel).field_0.x,Distance);
    (this->m_Vel).field_0.x = fVar20;
    iVar15 = this->m_Direction;
  }
  v = &this->m_Vel;
  if (iVar15 == 0) {
    (v->field_0).x = ((float)iVar4 / 100.0) * (v->field_0).x;
  }
  if (bVar13 != false) {
    *(byte *)&this->m_Jumped = (byte)this->m_Jumped & 0xfd;
  }
  uVar14 = this->m_HookState;
  if (uVar14 == 0) {
    this->m_HookedPlayer = -1;
  }
  else {
    if (uVar14 < 3) {
      this->m_HookState = uVar14 + 1;
      goto LAB_0013fce1;
    }
    if (uVar14 == 4) {
      fVar20 = (float)(this->m_pWorld->m_Tuning).m_HookFireSpeed.m_Value / 100.0;
      NewPos.field_0.x = (this->m_HookPos).field_0.x + fVar20 * (this->m_HookDir).field_0.x;
      NewPos.field_1.y = (this->m_HookPos).field_1.y + fVar20 * (this->m_HookDir).field_1.y;
      aVar22 = (this->m_Pos).field_0;
      aVar31 = (this->m_Pos).field_1;
      fVar21 = (float)(this->m_pWorld->m_Tuning).m_HookLength.m_Value / 100.0;
      if (fVar21 < SQRT((aVar22.x - NewPos.field_0.x) * (aVar22.x - NewPos.field_0.x) +
                        (aVar31.y - NewPos.field_1.y) * (aVar31.y - NewPos.field_1.y))) {
        this->m_HookState = 1;
        auVar35._0_4_ = NewPos.field_0.x - aVar22.x;
        auVar35._4_4_ = NewPos.field_1.y - aVar31.y;
        auVar35._8_4_ = (fVar20 * 0.0 + 0.0) - 0.0;
        auVar35._12_4_ = (fVar20 * 0.0 + 0.0) - 0.0;
        auVar42._0_4_ = SQRT(auVar35._0_4_ * auVar35._0_4_ + auVar35._4_4_ * auVar35._4_4_);
        auVar42._4_4_ = auVar42._0_4_;
        auVar42._8_4_ = auVar42._0_4_;
        auVar42._12_4_ = auVar42._0_4_;
        auVar38 = divps(auVar35,auVar42);
        NewPos.field_0.x = fVar21 * auVar38._0_4_ + aVar22.x;
        NewPos.field_1.y = fVar21 * auVar38._4_4_ + aVar31.y;
      }
      a = &this->m_HookPos;
      uVar16 = CCollision::IntersectLine
                         (this->m_pCollision,this->m_HookPos,NewPos,&NewPos,(vec2 *)0x0);
      if (this->m_pWorld != (CWorldCore *)0x0) {
        fVar20 = (float)(this->m_pWorld->m_Tuning).m_PlayerHooking.m_Value / 100.0;
        auVar9._12_4_ = 0;
        auVar9._0_12_ = auStack_84;
        _Distance = auVar9 << 0x20;
        if ((fVar20 != 0.0) || (NAN(fVar20))) {
          for (lVar17 = 0; lVar17 != 0x40; lVar17 = lVar17 + 1) {
            pCVar7 = this->m_pWorld->m_apCharacters[lVar17];
            if ((pCVar7 != this && pCVar7 != (CCharacterCore *)0x0) &&
               (vVar24.field_0 = a->field_0, vVar24.field_1 = a->field_1,
               target_point.field_0 = (pCVar7->m_Pos).field_0,
               target_point.field_1 = (pCVar7->m_Pos).field_1,
               vVar24 = closest_point_on_line<float>(vVar24,NewPos,target_point),
               fVar20 = (pCVar7->m_Pos).field_0.x - vVar24.field_0.x,
               fVar21 = (pCVar7->m_Pos).field_1.y - vVar24.field_1.y,
               SQRT(fVar20 * fVar20 + fVar21 * fVar21) < 30.0)) {
              if (this->m_HookedPlayer != -1) {
                fVar20 = distance<float>(a,&pCVar7->m_Pos);
                if (Distance <= fVar20) goto LAB_001400d0;
              }
              *(byte *)&this->m_TriggeredEvents = (byte)this->m_TriggeredEvents | 4;
              this->m_HookState = 5;
              this->m_HookedPlayer = (int)lVar17;
              fVar20 = distance<float>(a,&pCVar7->m_Pos);
              Distance = fVar20;
            }
LAB_001400d0:
          }
        }
      }
      uVar14 = this->m_HookState;
      if (uVar14 == 4) {
        if (uVar16 == 0) {
          uVar14 = 4;
        }
        else {
          this->m_TriggeredEvents = this->m_TriggeredEvents | (uint)((uVar16 & 4) != 0) * 8 + 8;
          uVar14 = uVar16 & 4 ^ 5;
          this->m_HookState = uVar14;
        }
        *a = NewPos;
      }
    }
    else if (uVar14 == 3) {
      this->m_HookState = -1;
      goto LAB_0013fce1;
    }
    if (uVar14 != 5) goto LAB_0013fce1;
    iVar15 = this->m_HookedPlayer;
    if ((long)iVar15 == -1) {
LAB_00140176:
      fVar20 = distance<float>(&this->m_HookPos,&this->m_Pos);
      if (46.0 < fVar20) {
        fVar20 = (float)(this->m_pWorld->m_Tuning).m_HookDragAccel.m_Value / 100.0;
        auVar36._0_4_ = (this->m_HookPos).field_0.x - (this->m_Pos).field_0.x;
        auVar36._4_4_ = (this->m_HookPos).field_1.y - (this->m_Pos).field_1.y;
        auVar36._8_8_ = 0;
        auVar39._0_4_ = SQRT(auVar36._0_4_ * auVar36._0_4_ + auVar36._4_4_ * auVar36._4_4_);
        auVar39._4_4_ = auVar39._0_4_;
        auVar39._8_4_ = auVar39._0_4_;
        auVar39._12_4_ = auVar39._0_4_;
        auVar38 = divps(auVar36,auVar39);
        fVar21 = fVar20 * auVar38._0_4_;
        fVar20 = fVar20 * auVar38._4_4_;
        if (0.0 < fVar20) {
          fVar20 = fVar20 * 0.3;
        }
        fVar40 = 0.95;
        if ((0.0 <= fVar21 || -1 < this->m_Direction) && (fVar21 <= 0.0 || this->m_Direction < 1)) {
          fVar40 = 0.75;
        }
        aVar22 = (*v).field_0;
        vVar28.field_0.x = fVar40 * fVar21 + aVar22.x;
        aVar31 = (*v).field_1;
        vVar28.field_1.y = fVar20 + aVar31.y;
        fVar20 = SQRT(vVar28.field_0.x * vVar28.field_0.x + vVar28.field_1.y * vVar28.field_1.y);
        if ((fVar20 < (float)(this->m_pWorld->m_Tuning).m_HookDragSpeed.m_Value / 100.0) ||
           (fVar20 < SQRT(aVar22.x * aVar22.x + aVar31.y * aVar31.y))) {
          *v = vVar28;
        }
      }
      iVar15 = this->m_HookedPlayer;
    }
    else {
      pCVar7 = this->m_pWorld->m_apCharacters[iVar15];
      if (pCVar7 == (CCharacterCore *)0x0) {
        this->m_HookState = -1;
        this->m_HookedPlayer = -1;
        this->m_HookPos = this->m_Pos;
        goto LAB_00140176;
      }
      this->m_HookPos = pCVar7->m_Pos;
    }
    iVar3 = this->m_HookTick;
    this->m_HookTick = iVar3 + 1;
    if ((iVar15 == -1) ||
       ((iVar3 < 0x3c && (this->m_pWorld->m_apCharacters[iVar15] != (CCharacterCore *)0x0))))
    goto LAB_0013fce1;
    this->m_HookState = -1;
    this->m_HookedPlayer = -1;
  }
  this->m_HookPos = this->m_Pos;
LAB_0013fce1:
  if (this->m_pWorld != (CWorldCore *)0x0) {
    for (uVar19 = 0; uVar19 != 0x40; uVar19 = uVar19 + 1) {
      pCVar7 = this->m_pWorld->m_apCharacters[uVar19];
      if (pCVar7 != this && pCVar7 != (CCharacterCore *)0x0) {
        fVar20 = distance<float>(&this->m_Pos,&pCVar7->m_Pos);
        auVar41._0_4_ = (this->m_Pos).field_0.x - (pCVar7->m_Pos).field_0.x;
        auVar41._4_4_ = (this->m_Pos).field_1.y - (pCVar7->m_Pos).field_1.y;
        auVar41._8_8_ = 0;
        auVar34._0_4_ = SQRT(auVar41._0_4_ * auVar41._0_4_ + auVar41._4_4_ * auVar41._4_4_);
        auVar34._4_4_ = auVar34._0_4_;
        auVar34._8_4_ = auVar34._0_4_;
        auVar34._12_4_ = auVar34._0_4_;
        auVar38 = divps(auVar41,auVar34);
        fVar21 = (float)(this->m_pWorld->m_Tuning).m_PlayerCollision.m_Value / 100.0;
        fVar40 = auVar38._0_4_;
        fVar43 = auVar38._4_4_;
        if (((0.0 < fVar20) && (fVar20 < 35.0)) && ((fVar21 != 0.0 || (NAN(fVar21))))) {
          vVar23 = *v;
          fVar21 = 0.375;
          if (0.0001 < SQRT(vVar23.field_0.x * vVar23.field_0.x +
                            vVar23.field_1.y * vVar23.field_1.y)) {
            vVar24 = normalize(v);
            fVar21 = ((vVar24.field_0.x * fVar40 + fVar43 * vVar24.field_1.y + 1.0) * -0.5 + 1.0) *
                     0.75;
            vVar23 = *v;
          }
          vVar25.field_0.x = (fVar21 * (40.600002 - fVar20) * fVar40 + vVar23.field_0.x) * 0.85;
          vVar25.field_1.y = (fVar21 * (40.600002 - fVar20) * fVar43 + vVar23.field_1.y) * 0.85;
          *v = vVar25;
        }
        if (uVar19 == (uint)this->m_HookedPlayer) {
          pCVar6 = this->m_pWorld;
          fVar21 = (float)(pCVar6->m_Tuning).m_PlayerHooking.m_Value / 100.0;
          if ((42.0 < fVar20) && ((fVar21 != 0.0 || (NAN(fVar21))))) {
            auVar30._0_4_ = (float)(pCVar6->m_Tuning).m_HookDragAccel.m_Value;
            auVar30._4_4_ = (float)(pCVar6->m_Tuning).m_HookLength.m_Value;
            auVar30._8_8_ = 0;
            auVar38 = divps(auVar30,_DAT_00141f70);
            fVar20 = (fVar20 / auVar38._4_4_) * auVar38._0_4_;
            fVar40 = fVar40 * fVar20;
            fVar43 = fVar43 * fVar20;
            vVar33.field_0.x = (pCVar7->m_HookDragVel).field_0.x + fVar40 * 1.5;
            vVar33.field_1.y = (pCVar7->m_HookDragVel).field_1.y + fVar43 * 1.5;
            pCVar7->m_HookDragVel = vVar33;
            vVar26.field_0.x = (this->m_HookDragVel).field_0.x + fVar40 * -0.25;
            vVar26.field_1.y = (this->m_HookDragVel).field_1.y + fVar43 * -0.25;
            this->m_HookDragVel = vVar26;
          }
        }
      }
    }
  }
  fVar20 = (this->m_Vel).field_0.x;
  fVar21 = (this->m_Vel).field_1.y;
  if (6000.0 < SQRT(fVar20 * fVar20 + fVar21 * fVar21)) {
    vVar24 = normalize(v);
    vVar27.field_0.x = vVar24.field_0.x * 6000.0;
    vVar27.field_1.y = vVar24.field_1.y * 6000.0;
    *v = vVar27;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar5) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CCharacterCore::Tick(bool UseInput)
{
	m_TriggeredEvents = 0;

	// get ground state
	const bool Grounded =
		m_pCollision->CheckPoint(m_Pos.x+PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5)
		|| m_pCollision->CheckPoint(m_Pos.x-PHYS_SIZE/2, m_Pos.y+PHYS_SIZE/2+5);

	vec2 TargetDirection = normalize(vec2(m_Input.m_TargetX, m_Input.m_TargetY));

	m_Vel.y += m_pWorld->m_Tuning.m_Gravity;

	float MaxSpeed = Grounded ? m_pWorld->m_Tuning.m_GroundControlSpeed : m_pWorld->m_Tuning.m_AirControlSpeed;
	float Accel = Grounded ? m_pWorld->m_Tuning.m_GroundControlAccel : m_pWorld->m_Tuning.m_AirControlAccel;
	float Friction = Grounded ? m_pWorld->m_Tuning.m_GroundFriction : m_pWorld->m_Tuning.m_AirFriction;

	// handle input
	if(UseInput)
	{
		m_Direction = m_Input.m_Direction;
		m_Angle = (int)(angle(vec2(m_Input.m_TargetX, m_Input.m_TargetY))*256.0f);

		// handle jump
		if(m_Input.m_Jump)
		{
			if(!(m_Jumped&1))
			{
				if(Grounded)
				{
					m_TriggeredEvents |= COREEVENTFLAG_GROUND_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_GroundJumpImpulse;
					m_Jumped |= 1;
				}
				else if(!(m_Jumped&2))
				{
					m_TriggeredEvents |= COREEVENTFLAG_AIR_JUMP;
					m_Vel.y = -m_pWorld->m_Tuning.m_AirJumpImpulse;
					m_Jumped |= 3;
				}
			}
		}
		else
			m_Jumped &= ~1;

		// handle hook
		if(m_Input.m_Hook)
		{
			if(m_HookState == HOOK_IDLE)
			{
				m_HookState = HOOK_FLYING;
				m_HookPos = m_Pos+TargetDirection*PHYS_SIZE*1.5f;
				m_HookDir = TargetDirection;
				m_HookedPlayer = -1;
				m_HookTick = 0;
				//m_TriggeredEvents |= COREEVENTFLAG_HOOK_LAUNCH;
			}
		}
		else
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_IDLE;
			m_HookPos = m_Pos;
		}
	}

	// add the speed modification according to players wanted direction
	if(m_Direction < 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, -Accel);
	if(m_Direction > 0)
		m_Vel.x = SaturatedAdd(-MaxSpeed, MaxSpeed, m_Vel.x, Accel);
	if(m_Direction == 0)
		m_Vel.x *= Friction;

	// handle jumping
	// 1 bit = to keep track if a jump has been made on this input
	// 2 bit = to keep track if a air-jump has been made
	if(Grounded)
		m_Jumped &= ~2;

	// do hook
	if(m_HookState == HOOK_IDLE)
	{
		m_HookedPlayer = -1;
		m_HookState = HOOK_IDLE;
		m_HookPos = m_Pos;
	}
	else if(m_HookState >= HOOK_RETRACT_START && m_HookState < HOOK_RETRACT_END)
	{
		m_HookState++;
	}
	else if(m_HookState == HOOK_RETRACT_END)
	{
		m_HookState = HOOK_RETRACTED;
		//m_TriggeredEvents |= COREEVENTFLAG_HOOK_RETRACT;
	}
	else if(m_HookState == HOOK_FLYING)
	{
		vec2 NewPos = m_HookPos+m_HookDir*m_pWorld->m_Tuning.m_HookFireSpeed;
		if(distance(m_Pos, NewPos) > m_pWorld->m_Tuning.m_HookLength)
		{
			m_HookState = HOOK_RETRACT_START;
			NewPos = m_Pos + normalize(NewPos-m_Pos) * m_pWorld->m_Tuning.m_HookLength;
		}

		// make sure that the hook doesn't go though the ground
		bool GoingToHitGround = false;
		bool GoingToRetract = false;
		int Hit = m_pCollision->IntersectLine(m_HookPos, NewPos, &NewPos, 0);
		if(Hit)
		{
			if(Hit&CCollision::COLFLAG_NOHOOK)
				GoingToRetract = true;
			else
				GoingToHitGround = true;
		}

		// Check against other players first
		if(m_pWorld && m_pWorld->m_Tuning.m_PlayerHooking)
		{
			float Distance = 0.0f;
			for(int i = 0; i < MAX_CLIENTS; i++)
			{
				CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
				if(!pCharCore || pCharCore == this)
					continue;

				vec2 ClosestPoint = closest_point_on_line(m_HookPos, NewPos, pCharCore->m_Pos);
				if(distance(pCharCore->m_Pos, ClosestPoint) < PHYS_SIZE+2.0f)
				{
					if(m_HookedPlayer == -1 || distance(m_HookPos, pCharCore->m_Pos) < Distance)
					{
						m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_PLAYER;
						m_HookState = HOOK_GRABBED;
						m_HookedPlayer = i;
						Distance = distance(m_HookPos, pCharCore->m_Pos);
					}
				}
			}
		}

		if(m_HookState == HOOK_FLYING)
		{
			// check against ground
			if(GoingToHitGround)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_ATTACH_GROUND;
				m_HookState = HOOK_GRABBED;
			}
			else if(GoingToRetract)
			{
				m_TriggeredEvents |= COREEVENTFLAG_HOOK_HIT_NOHOOK;
				m_HookState = HOOK_RETRACT_START;
			}

			m_HookPos = NewPos;
		}
	}

	if(m_HookState == HOOK_GRABBED)
	{
		if(m_HookedPlayer != -1)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[m_HookedPlayer];
			if(pCharCore)
				m_HookPos = pCharCore->m_Pos;
			else
			{
				// release hook
				m_HookedPlayer = -1;
				m_HookState = HOOK_RETRACTED;
				m_HookPos = m_Pos;
			}

			// keep players hooked for a max of 1.5sec
			//if(Server()->Tick() > hook_tick+(Server()->TickSpeed()*3)/2)
				//release_hooked();
		}

		// don't do this hook rutine when we are hook to a player
		if(m_HookedPlayer == -1 && distance(m_HookPos, m_Pos) > 46.0f)
		{
			vec2 HookVel = normalize(m_HookPos-m_Pos)*m_pWorld->m_Tuning.m_HookDragAccel;
			// the hook as more power to drag you up then down.
			// this makes it easier to get on top of an platform
			if(HookVel.y > 0)
				HookVel.y *= 0.3f;

			// the hook will boost it's power if the player wants to move
			// in that direction. otherwise it will dampen everything abit
			if((HookVel.x < 0 && m_Direction < 0) || (HookVel.x > 0 && m_Direction > 0))
				HookVel.x *= 0.95f;
			else
				HookVel.x *= 0.75f;

			vec2 NewVel = m_Vel+HookVel;

			// check if we are under the legal limit for the hook
			if(length(NewVel) < m_pWorld->m_Tuning.m_HookDragSpeed || length(NewVel) < length(m_Vel))
				m_Vel = NewVel; // no problem. apply

		}

		// release hook (max hook time is 1.25
		m_HookTick++;
		if(m_HookedPlayer != -1 && (m_HookTick > SERVER_TICK_SPEED+SERVER_TICK_SPEED/5 || !m_pWorld->m_apCharacters[m_HookedPlayer]))
		{
			m_HookedPlayer = -1;
			m_HookState = HOOK_RETRACTED;
			m_HookPos = m_Pos;
		}
	}

	if(m_pWorld)
	{
		for(int i = 0; i < MAX_CLIENTS; i++)
		{
			CCharacterCore *pCharCore = m_pWorld->m_apCharacters[i];
			if(!pCharCore)
				continue;

			//player *p = (player*)ent;
			if(pCharCore == this) // || !(p->flags&FLAG_ALIVE)
				continue; // make sure that we don't nudge our self

			// handle player <-> player collision
			float Distance = distance(m_Pos, pCharCore->m_Pos);
			vec2 Dir = normalize(m_Pos - pCharCore->m_Pos);
			if(m_pWorld->m_Tuning.m_PlayerCollision && Distance < PHYS_SIZE*1.25f && Distance > 0.0f)
			{
				float a = (PHYS_SIZE*1.45f - Distance);
				float Velocity = 0.5f;

				// make sure that we don't add excess force by checking the
				// direction against the current velocity. if not zero.
				if(length(m_Vel) > 0.0001)
					Velocity = 1-(dot(normalize(m_Vel), Dir)+1)/2;

				m_Vel += Dir*a*(Velocity*0.75f);
				m_Vel *= 0.85f;
			}

			// handle hook influence
			if(m_HookedPlayer == i && m_pWorld->m_Tuning.m_PlayerHooking)
			{
				if(Distance > PHYS_SIZE*1.50f) // TODO: fix tweakable variable
				{
					float Accel = m_pWorld->m_Tuning.m_HookDragAccel * (Distance/m_pWorld->m_Tuning.m_HookLength);

					// add force to the hooked player
					pCharCore->m_HookDragVel += Dir*Accel*1.5f;

					// add a little bit force to the guy who has the grip
					m_HookDragVel -= Dir*Accel*0.25f;
				}
			}
		}
	}

	// clamp the velocity to something sane
	if(length(m_Vel) > 6000)
		m_Vel = normalize(m_Vel) * 6000;
}